

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.hpp
# Opt level: O2

void __thiscall
duckdb::CorrelatedColumnInfo::CorrelatedColumnInfo
          (CorrelatedColumnInfo *this,BoundColumnRefExpression *expr)

{
  ColumnBinding binding;
  LogicalType local_60;
  string local_48;
  
  binding = expr->binding;
  LogicalType::LogicalType(&local_60,&(expr->super_Expression).return_type);
  (*(expr->super_Expression).super_BaseExpression._vptr_BaseExpression[7])(&local_48,expr);
  CorrelatedColumnInfo(this,binding,&local_60,&local_48,expr->depth);
  ::std::__cxx11::string::~string((string *)&local_48);
  LogicalType::~LogicalType(&local_60);
  return;
}

Assistant:

explicit CorrelatedColumnInfo(BoundColumnRefExpression &expr)
	    : CorrelatedColumnInfo(expr.binding, expr.return_type, expr.GetName(), expr.depth) {
	}